

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O1

void pd_defaultpointer(t_pd *x,t_gpointer *gp)

{
  t_listmethod p_Var1;
  t_atom at;
  t_atom local_10;
  
  p_Var1 = (*x)->c_listmethod;
  local_10.a_w.w_gpointer = gp;
  if (p_Var1 == pd_defaultlist) {
    local_10.a_type = A_POINTER;
    (*(*x)->c_anymethod)(x,&s_pointer,1,&local_10);
  }
  else {
    local_10.a_type = A_POINTER;
    (*p_Var1)(x,(t_symbol *)0x0,1,&local_10);
  }
  return;
}

Assistant:

static void pd_defaultpointer(t_pd *x, t_gpointer *gp)
{
    if (*(*x)->c_listmethod != pd_defaultlist)
    {
        t_atom at;
        SETPOINTER(&at, gp);
        (*(*x)->c_listmethod)(x, 0, 1, &at);
    }
    else
    {
        t_atom at;
        SETPOINTER(&at, gp);
        (*(*x)->c_anymethod)(x, &s_pointer, 1, &at);
    }
}